

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void array_container_add_from_range(array_container_t *arr,uint32_t min,uint32_t max,uint16_t step)

{
  uint16_t in_CX;
  uint in_EDX;
  uint in_ESI;
  uint32_t value;
  undefined4 local_18;
  
  for (local_18 = in_ESI; local_18 < in_EDX; local_18 = in_CX + local_18) {
    array_container_append((array_container_t *)CONCAT44(in_ESI,in_EDX),in_CX);
  }
  return;
}

Assistant:

void array_container_add_from_range(array_container_t *arr, uint32_t min,
                                    uint32_t max, uint16_t step) {
    for (uint32_t value = min; value < max; value += step) {
        array_container_append(arr, value);
    }
}